

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::DuplicateColsPS(DuplicateColsPS *this,DuplicateColsPS *old)

{
  int iVar1;
  int32_t iVar2;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  byte bVar6;
  
  bVar6 = 0;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006a6da8;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar1 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateColsPS_006a76e8;
  iVar1 = old->m_k;
  this->m_j = old->m_j;
  this->m_k = iVar1;
  pnVar4 = &old->m_loJ;
  pnVar5 = &this->m_loJ;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_loJ).m_backend.exp = (old->m_loJ).m_backend.exp;
  (this->m_loJ).m_backend.neg = (old->m_loJ).m_backend.neg;
  iVar2 = (old->m_loJ).m_backend.prec_elem;
  (this->m_loJ).m_backend.fpclass = (old->m_loJ).m_backend.fpclass;
  (this->m_loJ).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_upJ;
  pnVar5 = &this->m_upJ;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_upJ).m_backend.exp = (old->m_upJ).m_backend.exp;
  (this->m_upJ).m_backend.neg = (old->m_upJ).m_backend.neg;
  iVar2 = (old->m_upJ).m_backend.prec_elem;
  (this->m_upJ).m_backend.fpclass = (old->m_upJ).m_backend.fpclass;
  (this->m_upJ).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_loK;
  pnVar5 = &this->m_loK;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_loK).m_backend.exp = (old->m_loK).m_backend.exp;
  (this->m_loK).m_backend.neg = (old->m_loK).m_backend.neg;
  iVar2 = (old->m_loK).m_backend.prec_elem;
  (this->m_loK).m_backend.fpclass = (old->m_loK).m_backend.fpclass;
  (this->m_loK).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_upK;
  pnVar5 = &this->m_upK;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_upK).m_backend.exp = (old->m_upK).m_backend.exp;
  (this->m_upK).m_backend.neg = (old->m_upK).m_backend.neg;
  iVar2 = (old->m_upK).m_backend.prec_elem;
  (this->m_upK).m_backend.fpclass = (old->m_upK).m_backend.fpclass;
  (this->m_upK).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_scale;
  pnVar5 = &this->m_scale;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_scale).m_backend.exp = (old->m_scale).m_backend.exp;
  (this->m_scale).m_backend.neg = (old->m_scale).m_backend.neg;
  iVar2 = (old->m_scale).m_backend.prec_elem;
  (this->m_scale).m_backend.fpclass = (old->m_scale).m_backend.fpclass;
  (this->m_scale).m_backend.prec_elem = iVar2;
  this->m_isFirst = old->m_isFirst;
  this->m_isLast = old->m_isLast;
  DataArray<int>::DataArray(&this->m_perm,&old->m_perm);
  return;
}

Assistant:

DuplicateColsPS(const DuplicateColsPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_loJ(old.m_loJ)
         , m_upJ(old.m_upJ)
         , m_loK(old.m_loK)
         , m_upK(old.m_upK)
         , m_scale(old.m_scale)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_perm(old.m_perm)
      {}